

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *gen)

{
  secp256k1_fe *rzr;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_ge genp;
  int local_1ac;
  secp256k1_scalar local_1a8;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_pedersen_commit_cold_4();
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_pedersen_commit_cold_3();
  }
  else if (blind == (uchar *)0x0) {
    secp256k1_pedersen_commit_cold_2();
  }
  else {
    if (gen != (secp256k1_generator *)0x0) {
      rzr = (secp256k1_fe *)value;
      secp256k1_fe_set_b32(&local_88.x,gen->data);
      secp256k1_fe_set_b32(&local_88.y,gen->data + 0x20);
      local_88.infinity = 0;
      secp256k1_scalar_set_b32(&local_1a8,blind,&local_1ac);
      if (local_1ac != 0) {
        return 0;
      }
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_188,&local_1a8);
      secp256k1_pedersen_ecmult_small(&local_108,value,&local_88);
      secp256k1_gej_add_var(&local_188,&local_188,&local_108,rzr);
      if (local_188.infinity == 0) {
        secp256k1_ge_set_gej((secp256k1_ge *)&local_108,&local_188);
        secp256k1_pedersen_commitment_save(commit,(secp256k1_ge *)&local_108);
      }
      return (uint)(local_188.infinity == 0);
    }
    secp256k1_pedersen_commit_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* gen) {
    secp256k1_ge genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(gen != NULL);
    secp256k1_generator_load(&genp, gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&ctx->ecmult_gen_ctx, &rj, &sec, value, &genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}